

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O2

bool __thiscall
HighsHashTable<unsigned_long,void>::insert<unsigned_long&>
          (HighsHashTable<unsigned_long,void> *this,unsigned_long *args)

{
  u8 uVar1;
  long lVar2;
  long lVar3;
  unsigned_long uVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  u8 meta;
  u64 pos;
  Entry entry;
  u64 maxPos;
  u64 startPos;
  u8 local_29;
  ulong local_28;
  HighsHashTableEntry<unsigned_long,_void> local_20;
  ulong local_18;
  ulong local_10;
  
  local_20.value_ = *args;
  bVar5 = HighsHashTable<unsigned_long,_void>::findPosition
                    ((HighsHashTable<unsigned_long,_void> *)this,&local_20.value_,&local_29,
                     &local_10,&local_18,&local_28);
  if (bVar5) {
    bVar5 = false;
  }
  else {
    uVar6 = *(ulong *)(this + 0x10);
    if ((*(ulong *)(this + 0x20) != uVar6 * 7 + 7 >> 3) && (local_28 != local_18)) {
      lVar2 = *(long *)this;
      *(ulong *)(this + 0x20) = *(ulong *)(this + 0x20) + 1;
      uVar7 = local_18;
      do {
        lVar3 = *(long *)(this + 8);
        if (-1 < (char)*(byte *)(lVar3 + local_28)) {
          *(u8 *)(lVar3 + local_28) = local_29;
          *(unsigned_long *)(lVar2 + local_28 * 8) = local_20.value_;
          return true;
        }
        uVar8 = (ulong)((int)local_28 - (uint)*(byte *)(lVar3 + local_28) & 0x7f);
        if (uVar8 < (local_28 - local_10 & uVar6)) {
          uVar4 = *(unsigned_long *)(lVar2 + local_28 * 8);
          *(unsigned_long *)(lVar2 + local_28 * 8) = local_20.value_;
          uVar1 = *(u8 *)(lVar3 + local_28);
          *(u8 *)(lVar3 + local_28) = local_29;
          uVar6 = *(ulong *)(this + 0x10);
          local_10 = local_28 - uVar8 & uVar6;
          uVar7 = local_10 + 0x7f & uVar6;
          local_29 = uVar1;
          local_20.value_ = uVar4;
          local_18 = uVar7;
        }
        local_28 = local_28 + 1 & uVar6;
      } while (local_28 != uVar7);
      HighsHashTable<unsigned_long,_void>::growTable((HighsHashTable<unsigned_long,_void> *)this);
      insert<HighsHashTableEntry<unsigned_long,void>>(this,&local_20);
      return true;
    }
    HighsHashTable<unsigned_long,_void>::growTable((HighsHashTable<unsigned_long,_void> *)this);
    bVar5 = insert<HighsHashTableEntry<unsigned_long,void>>(this,&local_20);
  }
  return bVar5;
}

Assistant:

bool insert(Args&&... args) {
    Entry entry(std::forward<Args>(args)...);

    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(entry.key(), meta, startPos, maxPos, pos)) return false;

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return insert(std::move(entry));
    }

    using std::swap;
    Entry* entryArray = entries.get();
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return true;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return true;
  }